

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computePostequiExpVecs
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *preRowscale,
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               *preColscale,DataArray<int> *rowscaleExp,DataArray<int> *colscaleExp,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  DataArray<int> *scaleExp;
  bool rowRatio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  rowRatio = SUB81(colscaleExp,0);
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_160,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preRowscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x0,rowRatio);
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_198,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preColscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x1,rowRatio);
  if ((local_160.fpclass != cpp_dec_float_NaN) && (local_198.fpclass != cpp_dec_float_NaN)) {
    iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_160,&local_198);
    if (iVar1 < 0) {
      local_68.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_68.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_68.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_68.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_68.m_backend.exp = (epsilon->m_backend).exp;
      local_68.m_backend.neg = (epsilon->m_backend).neg;
      local_68.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_68.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      computeEquiExpVec(&(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,preRowscale,colscaleExp,&local_68);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      epsilon_00 = &local_a8;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_a8.m_backend.exp = (epsilon->m_backend).exp;
      local_a8.m_backend.neg = (epsilon->m_backend).neg;
      local_a8.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_a8.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      scaleExp = rowscaleExp;
      rowscaleExp = colscaleExp;
      goto LAB_002f18ed;
    }
  }
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (epsilon->m_backend).exp;
  local_e8.m_backend.neg = (epsilon->m_backend).neg;
  local_e8.m_backend.fpclass = (epsilon->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)lp,preColscale,rowscaleExp,&local_e8);
  lp = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)&lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8)
  ;
  epsilon_00 = &local_128;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4)
  ;
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6)
  ;
  local_128.m_backend.exp = (epsilon->m_backend).exp;
  local_128.m_backend.neg = (epsilon->m_backend).neg;
  local_128.m_backend.fpclass = (epsilon->m_backend).fpclass;
  local_128.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
  scaleExp = colscaleExp;
LAB_002f18ed:
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)lp,rowscaleExp,scaleExp,epsilon_00);
  return;
}

Assistant:

void SPxEquiliSC<R>::computePostequiExpVecs(const SPxLPBase<R>& lp,
      const std::vector<R>& preRowscale, const std::vector<R>& preColscale,
      DataArray<int>& rowscaleExp, DataArray<int>& colscaleExp, R epsilon)
{
   const R colratio = maxPrescaledRatio(lp, preRowscale, false);
   const R rowratio = maxPrescaledRatio(lp, preColscale, true);

   const bool colFirst = colratio < rowratio;

   // see SPxEquiliSC<R>::scale for reason behind this branch
   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), preRowscale, colscaleExp, epsilon);
      computeEquiExpVec(lp.rowSet(), colscaleExp, rowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), preColscale, rowscaleExp, epsilon);
      computeEquiExpVec(lp.colSet(), rowscaleExp, colscaleExp, epsilon);
   }
}